

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O3

error __thiscall memory::address<false,20,24,0>(memory *this,context *ctx,token *token,opcode *op)

{
  byte bVar1;
  error *tmpres___LINE__;
  ulong uVar2;
  undefined1 local_60 [16];
  token_predicate tStack_50;
  char *local_48;
  int iStack_40;
  int iStack_3c;
  int local_38;
  
  confirm_type((token *)this,(token_type)token);
  if (*(long *)this == 0) {
    context::tokenize((token *)(local_60 + 8),ctx);
    token->column = local_38;
    (token->data).string._M_str = local_48;
    token->type = iStack_40;
    token->line = iStack_3c;
    token->filename = (char *)local_60._8_8_;
    (token->data).predicate = tStack_50;
    uVar2 = 0xff00;
    if (token->type == regster) {
      bVar1 = (token->data).regster;
      context::tokenize((token *)(local_60 + 8),ctx);
      token->column = local_38;
      (token->data).string._M_str = local_48;
      token->type = iStack_40;
      token->line = iStack_3c;
      token->filename = (char *)local_60._8_8_;
      (token->data).predicate = tStack_50;
      try_reuse((context *)local_60,(token *)ctx,(opcode *)token,(int)op);
      if ((void *)local_60._0_8_ != (void *)0x0) {
        operator_delete__((void *)local_60._0_8_);
      }
      local_60._0_8_ = (void *)0x0;
      uVar2 = (ulong)bVar1 << 8;
    }
    if (((uint)op->value & (uint)uVar2) != 0) {
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    op->value = op->value | uVar2;
    confirm_type((token *)this,(token_type)token);
    if (*(long *)this == 0) {
      context::tokenize((token *)(local_60 + 8),ctx);
      token->column = local_38;
      (token->data).string._M_str = local_48;
      token->type = iStack_40;
      token->line = iStack_3c;
      token->filename = (char *)local_60._8_8_;
      (token->data).predicate = tStack_50;
      *(undefined8 *)this = 0;
    }
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(address)
    {
        CHECK(confirm_type(token, token_type::bracket_left));

        token = ctx.tokenize();
        uint8_t regster = ZERO_REGISTER;
        if (token.type == token_type::regster) {
            regster = token.data.regster;
            token = ctx.tokenize();

            try_reuse(ctx, token, op, 8);
        }
        op.add_bits(static_cast<uint64_t>(regster) << 8);

        if constexpr (imm_offset) {
            if (token.type == token_type::immediate) {
                const int is_zero_reg = regster == ZERO_REGISTER;
                const int64_t min = is_zero_reg ? 0 : -(1 << (size - 1));
                const int64_t max = max_bits(is_zero_reg ? size : (size - 1));

                uint64_t value;
                CHECK(convert_integer(token, min, max, &value));
                value >>= shr;
                op.add_bits((value & max_bits(size)) << addr);
                token = ctx.tokenize();
            }
        }

        CHECK(confirm_type(token, token_type::bracket_right));
        token = ctx.tokenize();
        return {};
    }